

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void cmGlobalNinjaGenerator::WriteInclude(ostream *os,string *filename,string *comment)

{
  ostream *poVar1;
  
  WriteComment(os,comment);
  std::__ostream_insert<char,std::char_traits<char>>(os,"include ",8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(filename->_M_dataplus)._M_p,filename->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteInclude(std::ostream& os,
                                          const std::string& filename,
                                          const std::string& comment)
{
  cmGlobalNinjaGenerator::WriteComment(os, comment);
  os << "include " << filename << "\n";
}